

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLDateTime::parseTimeZone(XMLDateTime *this)

{
  int iVar1;
  SchemaDateTimeException *this_00;
  int pos;
  XMLDateTime *this_local;
  
  if (this->fStart < this->fEnd) {
    iVar1 = XMLString::indexOf(L"Z+-",this->fBuffer[this->fStart]);
    if (iVar1 == -1) {
      this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
      SchemaDateTimeException::SchemaDateTimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                 ,0x4d5,DateTime_tz_noUTCsign,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
      __cxa_throw(this_00,&SchemaDateTimeException::typeinfo,
                  SchemaDateTimeException::~SchemaDateTimeException);
    }
    this->fValue[7] = iVar1 + 1;
    getTimeZone(this,this->fStart);
  }
  return;
}

Assistant:

void XMLDateTime::parseTimeZone()
{
    //fStart points right after the date
  	if ( fStart < fEnd ) {
        int pos = XMLString::indexOf(UTC_SET, fBuffer[fStart]);
    	if (pos == NOT_FOUND) {
            ThrowXMLwithMemMgr1(SchemaDateTimeException
                    , XMLExcepts::DateTime_tz_noUTCsign
                    , fBuffer
                    , fMemoryManager);
   		}
   		else {
            fValue[utc] = pos+1;
  	        getTimeZone(fStart);
   		}
    }

    return;
}